

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodecompile.cc
# Opt level: O2

VarnodeTpl * __thiscall PcodeCompile::buildTemporary(PcodeCompile *this)

{
  int iVar1;
  VarnodeTpl *this_00;
  undefined4 extraout_var;
  ConstTpl local_70;
  ConstTpl local_50;
  ConstTpl local_30;
  
  this_00 = (VarnodeTpl *)operator_new(0x68);
  ConstTpl::ConstTpl(&local_30,this->uniqspace);
  iVar1 = (**this->_vptr_PcodeCompile)(this);
  ConstTpl::ConstTpl(&local_50,real,CONCAT44(extraout_var,iVar1));
  ConstTpl::ConstTpl(&local_70,real,0);
  VarnodeTpl::VarnodeTpl(this_00,&local_30,&local_50,&local_70);
  this_00->unnamed_flag = true;
  return this_00;
}

Assistant:

VarnodeTpl *PcodeCompile::buildTemporary(void)

{				// Build temporary variable (with zerosize)
  VarnodeTpl *res = new VarnodeTpl(ConstTpl(uniqspace),
				   ConstTpl(ConstTpl::real,allocateTemp()),
				   ConstTpl(ConstTpl::real,0));
  res->setUnnamed(true);
  return res;
}